

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMemoryFile.cpp
# Opt level: O1

bool __thiscall
irr::io::CMemoryWriteFile::seek(CMemoryWriteFile *this,long finalPos,bool relativeMovement)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,relativeMovement) == 0) {
    if ((-1 < finalPos) && (finalPos <= *(long *)&(this->super_IWriteFile).field_0x10))
    goto LAB_00208916;
  }
  else {
    finalPos = finalPos + *(long *)&(this->super_IWriteFile).field_0x18;
    if ((-1 < finalPos) && (finalPos <= *(long *)&(this->super_IWriteFile).field_0x10)) {
LAB_00208916:
      *(long *)&(this->super_IWriteFile).field_0x18 = finalPos;
      return true;
    }
  }
  return false;
}

Assistant:

bool CMemoryWriteFile::seek(long finalPos, bool relativeMovement)
{
	if (relativeMovement) {
		if (Pos + finalPos < 0 || Pos + finalPos > Len)
			return false;

		Pos += finalPos;
	} else {
		if (finalPos < 0 || finalPos > Len)
			return false;

		Pos = finalPos;
	}

	return true;
}